

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O3

void __thiscall ProxyClient::stop(ProxyClient *this,function<void_()> *closeCall)

{
  std::function<void_()>::operator=(&this->m_stopCall,closeCall);
  if (this->m_runStatus == RUN) {
    this->m_runStatus = STOP_ING;
    (**(code **)((long)(((this->m_pipe)._M_t.
                         super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>
                         .super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl)->
                       super_Runnable)._vptr_Runnable + 0x38))();
    (**(code **)(*(long *)&((this->m_tcpSvr)._M_t.
                            super___uniq_ptr_impl<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_net_uv::TCPServer_*,_std::default_delete<net_uv::TCPServer>_>
                            .super__Head_base<0UL,_net_uv::TCPServer_*,_false>._M_head_impl)->
                           super_Server + 0x38))();
    return;
  }
  return;
}

Assistant:

void ProxyClient::stop(const std::function<void()>& closeCall)
{
	m_stopCall = closeCall;
	if(m_runStatus == RUN_STATUS::RUN)
	{
		m_runStatus = RUN_STATUS::STOP_ING;
		m_pipe->closeClient();
		m_tcpSvr->stopServer();
	}
}